

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::Game(Game *this)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  Boards *this_00;
  uniform_int_distribution<int> dist;
  mt19937 engine;
  random_device seed_gen;
  param_type local_2730;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2728;
  random_device local_13a0;
  
  this->full = false;
  std::random_device::random_device(&local_13a0);
  uVar1 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&local_2728,(ulong)uVar1);
  local_2730._M_a = 4;
  local_2730._M_b = 8;
  this_00 = (Boards *)operator_new(0x420);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2730,&local_2728);
  rVar3 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2730,&local_2728);
  Boards::Boards(this_00,rVar2 * 2,rVar3 * 2);
  this->board = this_00;
  this->turn = -1;
  this->howturn = 0;
  std::random_device::~random_device(&local_13a0);
  return;
}

Assistant:

Game::Game(){
	std::random_device seed_gen;
	std::mt19937 engine(seed_gen());
	std::uniform_int_distribution<int> dist(4, 8);
	board = new Boards(dist(engine) * 2, dist(engine) * 2);
	turn = -1;
	howturn = 0;
}